

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  ulong uVar1;
  long lVar2;
  char *format;
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double y;
  undefined1 auVar6 [16];
  int width;
  int local_20;
  int local_1c;
  char cVar7;
  
  if (_glfwInitialized == '\0') {
    iVar3 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (mode == 0x33003) {
      if (handle[0x41] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        uVar1 = *(ulong *)(handle + 0x5c);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar1;
        if ((char)uVar1 == '\x03') {
          handle[0x5c] = (GLFWwindow)0x0;
        }
        auVar6[1] = -((char)uVar1 == '\0');
        auVar6[0] = 0xff;
        auVar6[2] = -((char)(uVar1 >> 8) == '\x03');
        auVar6[3] = -((char)(uVar1 >> 0x10) == '\x03');
        auVar6[4] = 0xff;
        cVar7 = (char)(uVar1 >> 0x20);
        auVar6[5] = -(cVar7 == '\0');
        auVar6[6] = -((char)(uVar1 >> 0x28) == '\0');
        auVar6[7] = -((char)(uVar1 >> 0x30) == '\0');
        auVar6[8] = 0xff;
        auVar6[9] = 0xff;
        auVar6[10] = 0xff;
        auVar6[0xb] = 0xff;
        auVar6[0xc] = 0xff;
        auVar6[0xd] = 0xff;
        auVar6[0xe] = 0xff;
        auVar6[0xf] = 0xff;
        if ((auVar6[2] & 1) != 0) {
          handle[0x5d] = (GLFWwindow)0x0;
        }
        auVar5 = pshuflw(auVar6,auVar5,0x55);
        if (auVar5[4] == '\x03') {
          handle[0x5e] = (GLFWwindow)0x0;
        }
        if ((char)(uVar1 >> 0x18) == '\x03') {
          handle[0x5f] = (GLFWwindow)0x0;
        }
        if (cVar7 == '\0') {
          handle[0x60] = (GLFWwindow)0x0;
        }
        handle[0x61] = (GLFWwindow)0x0;
        handle[0x62] = (GLFWwindow)0x0;
        handle[99] = (GLFWwindow)0x0;
      }
      handle[0x41] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33002) {
      if (handle[0x40] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        lVar2 = 100;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1c1);
      }
      handle[0x40] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33001) {
      if (0xfffffffc < value - 0x34004U) {
        iVar3 = *(int *)(handle + 0x58);
        if (iVar3 == value) {
          return;
        }
        *(int *)(handle + 0x58) = value;
        if (_glfw.focusedWindow != (_GLFWwindow *)handle) {
          return;
        }
        dVar4 = _glfw.cursorPosX;
        y = _glfw.cursorPosY;
        if (iVar3 != 0x34003) {
          if (value != 0x34003) goto LAB_001bce0f;
          _glfwPlatformGetCursorPos((_GLFWwindow *)handle,&_glfw.cursorPosX,&_glfw.cursorPosY);
          dVar4 = _glfw.cursorPosY;
          *(double *)(handle + 0x48) = _glfw.cursorPosX;
          *(double *)(handle + 0x50) = dVar4;
          _glfwPlatformGetWindowSize((_GLFWwindow *)handle,&local_1c,&local_20);
          dVar4 = (double)(local_1c / 2);
          y = (double)(local_20 / 2);
        }
        _glfwPlatformSetCursorPos((_GLFWwindow *)handle,dVar4,y);
LAB_001bce0f:
        _glfwPlatformApplyCursorMode((_GLFWwindow *)handle);
        return;
      }
      format = "Invalid cursor mode";
    }
    else {
      format = "Invalid input mode";
    }
    iVar3 = 0x10003;
  }
  _glfwInputError(iVar3,format);
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode");
            break;
    }
}